

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O1

Query * __thiscall RoomMath::generate(Query *__return_storage_ptr__,RoomMath *this)

{
  pointer pQVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  Query *query;
  pointer pQVar5;
  undefined8 uVar6;
  _func_int **unaff_R12;
  int i;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  int local_80;
  int local_7c;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  local_78 = 0;
  uStack_70 = 0;
  uStack_6c = 0;
  iVar7 = 0;
  fVar10 = 0.0;
  do {
    iVar3 = rand();
    iVar4 = rand();
    fVar8 = (float)iVar3 * 4.656613e-10 * 1.5 + -0.75;
    fVar9 = (float)iVar4 * 4.656613e-10 * 1.5 + -0.75;
    pQVar5 = (this->super_RoomBase).pool.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_start;
    pQVar1 = (this->super_RoomBase).pool.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar14 = 1e+06;
    if (pQVar5 != pQVar1) {
      fVar14 = 1e+06;
      do {
        fVar11 = fVar8 - pQVar5->x;
        fVar15 = fVar9 - pQVar5->y;
        fVar11 = fVar11 * fVar11 + fVar15 * fVar15;
        if (fVar14 <= fVar11) {
          fVar11 = fVar14;
        }
        fVar14 = fVar11;
        pQVar5 = pQVar5 + 1;
      } while (pQVar5 != pQVar1);
    }
    uVar12 = (int)((uint)(fVar10 < fVar14) << 0x1f) >> 0x1f;
    uVar13 = (int)((uint)(fVar10 < fVar14) << 0x1f) >> 0x1f;
    local_78 = CONCAT44(~uVar13 & local_78._4_4_ | (uint)fVar9 & uVar13,
                        ~uVar12 & (uint)local_78 | (uint)fVar8 & uVar12);
    if (fVar14 <= fVar10) {
      fVar14 = fVar10;
    }
    fVar10 = fVar14;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x20);
  iVar7 = rand();
  local_80 = rand();
  local_80 = local_80 % 100;
  local_7c = iVar7 % 100;
  if ((this->getQuery).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->getQuery)._M_invoker)(&local_68,(_Any_data *)&this->getQuery,&local_7c,&local_80);
    __return_storage_ptr__->x = (float)(uint)local_78;
    __return_storage_ptr__->y = (float)local_78._4_4_;
    __return_storage_ptr__->clientId = 0;
    __return_storage_ptr__->tGuessed_s = 0.0;
    (__return_storage_ptr__->text)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->text).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->text,local_68.first._M_dataplus._M_p,
               local_68.first._M_dataplus._M_p + local_68.first._M_string_length);
    (__return_storage_ptr__->answer)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->answer).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->answer,local_68.second._M_dataplus._M_p,
               local_68.second._M_dataplus._M_p + local_68.second._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
      operator_delete(local_68.second._M_dataplus._M_p,
                      local_68.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  uVar6 = std::__throw_bad_function_call();
  pp_Var2 = (this->super_RoomBase)._vptr_RoomBase;
  if (pp_Var2 != unaff_R12) {
    operator_delete(pp_Var2,(ulong)(*unaff_R12 + 1));
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_68);
  _Unwind_Resume(uVar6);
}

Assistant:

virtual Query generate() override {
        float dist = 0.0f;

        float x = 0.0f;
        float y = 0.0f;

        for (int i = 0; i < 32; ++i) {
            float cx = 1.50f*frand() - 0.75f;
            float cy = 1.50f*frand() - 0.75f;

            float curd = 1e6;
            for (auto & query : pool) {
                float dx = cx - query.x;
                float dy = cy - query.y;

                float d = dx*dx + dy*dy;
                if (d < curd) {
                    curd = d;
                }
            }

            if (curd > dist) {
                dist = curd;
                x = cx;
                y = cy;
            }
        }

        int a = rand()%100;
        int b = rand()%100;

        auto [ text, answer ] = getQuery(a, b);

        return { x, y, 0, 0.0f, text, answer };
    }